

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkResults
          (DrawTestBase *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  bool bVar1;
  GLuint y;
  uint y_00;
  GLuint x;
  GLuint x_00;
  int iVar2;
  vector<int,_std::allocator<int>_> texture_data;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (GLint *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_38,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,local_38._M_impl.super__Vector_impl_data._M_start);
  iVar2 = 0;
  for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 != 4; x_00 = x_00 + 1) {
      bVar1 = checkRegionR32I(this,x_00,y_00,iVar2 + x_00,
                              local_38._M_impl.super__Vector_impl_data._M_start);
      if (!bVar1) goto LAB_00d8b83c;
    }
    iVar2 = iVar2 + x_00;
  }
LAB_00d8b83c:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return 3 < y_00;
}

Assistant:

bool DrawTestBase::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	bool  check_result = true;
	GLint index		   = 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, index, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}